

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_add_quant_table
               (j_compress_ptr cinfo,int which_tbl,uint *basic_table,int scale_factor,
               boolean force_baseline)

{
  JQUANT_TBL **ppJVar1;
  JQUANT_TBL *pJVar2;
  long local_40;
  long temp;
  int i;
  JQUANT_TBL **qtblptr;
  boolean force_baseline_local;
  int scale_factor_local;
  uint *basic_table_local;
  int which_tbl_local;
  j_compress_ptr cinfo_local;
  
  if (cinfo->global_state != 100) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if ((which_tbl < 0) || (3 < which_tbl)) {
    cinfo->err->msg_code = 0x20;
    (cinfo->err->msg_parm).i[0] = which_tbl;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  ppJVar1 = cinfo->quant_tbl_ptrs + which_tbl;
  if (*ppJVar1 == (JQUANT_TBL *)0x0) {
    pJVar2 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
    *ppJVar1 = pJVar2;
  }
  for (temp._4_4_ = 0; temp._4_4_ < 0x40; temp._4_4_ = temp._4_4_ + 1) {
    local_40 = (long)((ulong)basic_table[temp._4_4_] * (long)scale_factor + 0x32) / 100;
    if (local_40 < 1) {
      local_40 = 1;
    }
    if (0x7fff < local_40) {
      local_40 = 0x7fff;
    }
    if ((force_baseline != 0) && (0xff < local_40)) {
      local_40 = 0xff;
    }
    (*ppJVar1)->quantval[temp._4_4_] = (UINT16)local_40;
  }
  (*ppJVar1)->sent_table = 0;
  return;
}

Assistant:

GLOBAL(void)
jpeg_add_quant_table (j_compress_ptr cinfo, int which_tbl,
		      const unsigned int *basic_table,
		      int scale_factor, boolean force_baseline)
/* Define a quantization table equal to the basic_table times
 * a scale factor (given as a percentage).
 * If force_baseline is TRUE, the computed quantization table entries
 * are limited to 1..255 for JPEG baseline compatibility.
 */
{
  JQUANT_TBL ** qtblptr;
  int i;
  long temp;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (which_tbl < 0 || which_tbl >= NUM_QUANT_TBLS)
    ERREXIT1(cinfo, JERR_DQT_INDEX, which_tbl);

  qtblptr = & cinfo->quant_tbl_ptrs[which_tbl];

  if (*qtblptr == NULL)
    *qtblptr = jpeg_alloc_quant_table((j_common_ptr) cinfo);

  for (i = 0; i < DCTSIZE2; i++) {
    temp = ((long) basic_table[i] * scale_factor + 50L) / 100L;
    /* limit the values to the valid range */
    if (temp <= 0L) temp = 1L;
    if (temp > 32767L) temp = 32767L; /* max quantizer needed for 12 bits */
    if (force_baseline && temp > 255L)
      temp = 255L;		/* limit to baseline range if requested */
    (*qtblptr)->quantval[i] = (UINT16) temp;
  }

  /* Initialize sent_table FALSE so table will be written to JPEG file. */
  (*qtblptr)->sent_table = FALSE;
}